

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

int __thiscall QMainWindowLayout::raise(QMainWindowLayout *this,int __sig)

{
  QDockAreaLayoutInfo *widget;
  QDockAreaLayoutInfo *extraout_RAX;
  undefined4 in_register_00000034;
  QDockAreaLayoutInfo *this_00;
  QDockAreaLayoutInfo *info;
  QWidget *in_stack_00000020;
  QMainWindowLayout *in_stack_00000028;
  
  this_00 = (QDockAreaLayoutInfo *)CONCAT44(in_register_00000034,__sig);
  widget = dockInfo(in_stack_00000028,in_stack_00000020);
  if ((widget != (QDockAreaLayoutInfo *)0x0) && ((widget->tabbed & 1U) != 0)) {
    QDockAreaLayoutInfo::setCurrentTab(this_00,(QWidget *)widget);
    widget = extraout_RAX;
  }
  return (int)widget;
}

Assistant:

void QMainWindowLayout::raise(QDockWidget *widget)
{
    QDockAreaLayoutInfo *info = dockInfo(widget);
    if (info == nullptr)
        return;
    if (!info->tabbed)
        return;
    info->setCurrentTab(widget);
}